

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buf_writer.c
# Opt level: O2

void duckdb_je_buf_writer_terminate(tsdn_t *tsdn,buf_writer_t *buf_writer)

{
  long *plVar1;
  rtree_ctx_t *rtree_ctx;
  void *pvVar2;
  uintptr_t key;
  size_t *key_00;
  uintptr_t in_R8;
  rtree_t *prVar3;
  rtree_metadata_t rVar4;
  rtree_ctx_t rtree_ctx_fallback;
  rtree_contents_t local_1b8;
  
  duckdb_je_buf_writer_flush(buf_writer);
  if ((buf_writer->internal_buf == true) &&
     (rtree_ctx = (rtree_ctx_t *)buf_writer->buf, rtree_ctx != (rtree_ctx_t *)0x0)) {
    if (tsdn == (tsdn_t *)0x0) {
      prVar3 = (rtree_t *)&stack0xfffffffffffffe60;
      duckdb_je_rtree_ctx_data_init((rtree_ctx_t *)prVar3);
    }
    else {
      prVar3 = (rtree_t *)
               &(tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
    }
    rtree_read(&local_1b8,tsdn,prVar3,rtree_ctx,in_R8);
    key = (uintptr_t)((uint)(local_1b8.edata)->e_bits & 0xfff);
    pvVar2 = duckdb_je_arenas[key].repr;
    if (tsdn == (tsdn_t *)0x0) {
      prVar3 = (rtree_t *)&stack0xfffffffffffffe60;
      duckdb_je_rtree_ctx_data_init((rtree_ctx_t *)prVar3);
    }
    else {
      prVar3 = (rtree_t *)
               &(tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
    }
    rVar4 = rtree_metadata_read(tsdn,prVar3,rtree_ctx,key);
    key_00 = duckdb_je_sz_index2size_tab;
    LOCK();
    plVar1 = (long *)((long)pvVar2 + 0x48);
    *plVar1 = *plVar1 - duckdb_je_sz_index2size_tab[rVar4.szind];
    UNLOCK();
    if (tsdn == (tsdn_t *)0x0) {
      prVar3 = (rtree_t *)&stack0xfffffffffffffe60;
      duckdb_je_rtree_ctx_data_init((rtree_ctx_t *)prVar3);
    }
    else {
      prVar3 = (rtree_t *)
               &(tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
    }
    rVar4 = rtree_metadata_read(tsdn,prVar3,rtree_ctx,(uintptr_t)key_00);
    if ((rVar4._8_4_ >> 8 & 1) == 0) {
      if (tsdn == (tsdn_t *)0x0) {
        prVar3 = (rtree_t *)&stack0xfffffffffffffe60;
        duckdb_je_rtree_ctx_data_init((rtree_ctx_t *)prVar3);
      }
      else {
        prVar3 = (rtree_t *)
                 &(tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
      }
      rtree_read(&local_1b8,tsdn,prVar3,rtree_ctx,in_R8);
      duckdb_je_large_dalloc(tsdn,local_1b8.edata);
    }
    else {
      duckdb_je_arena_dalloc_small(tsdn,rtree_ctx);
    }
  }
  return;
}

Assistant:

void
buf_writer_terminate(tsdn_t *tsdn, buf_writer_t *buf_writer) {
	buf_writer_assert(buf_writer);
	buf_writer_flush(buf_writer);
	if (buf_writer->internal_buf) {
		buf_writer_free_internal_buf(tsdn, buf_writer->buf);
	}
}